

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refinement_pattern.cc
# Opt level: O0

bool lf::geometry::isParallelogram(Matrix<int,__1,__1,_0,__1,__1> *polygon)

{
  PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *this;
  RealScalar RVar1;
  Index IVar2;
  CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *pCVar3;
  MatrixBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *other;
  Scalar local_2e8 [3];
  Scalar local_2dc;
  DenseBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> local_2d8 [16];
  CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> local_2c8;
  Product<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0> local_2a8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *local_18;
  Matrix<int,__1,__1,_0,__1,__1> *polygon_local;
  
  local_18 = (PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)polygon;
  IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)polygon);
  if (IVar2 != 2) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::operator<<(local_190,"Only planar polygons supported");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"polygon.rows() == 2",&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/refinement_pattern.cc"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x14,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/refinement_pattern.cc"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x14,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  this = local_18;
  if (IVar2 == 4) {
    Eigen::Matrix<int,_4,_1,_0,_4,_1>::Matrix((Matrix<int,_4,_1,_0,_4,_1> *)local_2d8);
    local_2dc = 1;
    Eigen::DenseBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::operator<<
              (&local_2c8,local_2d8,&local_2dc);
    local_2e8[2] = 0xffffffff;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::operator_
                       (&local_2c8,local_2e8 + 2);
    local_2e8[1] = 1;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::operator_
                       (pCVar3,local_2e8 + 1);
    local_2e8[0] = -1;
    pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::operator_
                       (pCVar3,local_2e8);
    other = (MatrixBase<Eigen::Matrix<int,_4,_1,_0,_4,_1>_> *)
            Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::finished(pCVar3);
    local_2a8 = Eigen::MatrixBase<Eigen::Matrix<int,-1,-1,0,-1,-1>>::operator*
                          ((MatrixBase<Eigen::Matrix<int,_1,_1,0,_1,_1>> *)this,other);
    RVar1 = Eigen::
            MatrixBase<Eigen::Product<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0>_>
            ::squaredNorm((MatrixBase<Eigen::Product<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_Eigen::Matrix<int,_4,_1,_0,_4,_1>,_0>_>
                           *)&local_2a8);
    polygon_local._7_1_ = RVar1 == 0;
    Eigen::CommaInitializer<Eigen::Matrix<int,_4,_1,_0,_4,_1>_>::~CommaInitializer(&local_2c8);
  }
  else {
    polygon_local._7_1_ = 0;
  }
  return (bool)(polygon_local._7_1_ & 1);
}

Assistant:

bool isParallelogram(
    const Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic> &polygon) {
  LF_ASSERT_MSG(polygon.rows() == 2, "Only planar polygons supported");
  // A parallelogram must have four vertices
  if (polygon.cols() != 4) {
    return false;
  }
  return ((polygon * (Eigen::Vector4i() << 1, -1, 1, -1).finished())
              .squaredNorm() == 0);
}